

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_MNDX.cpp
# Opt level: O3

void __thiscall TStruct40::BeginSearch(TStruct40 *this)

{
  uint uVar1;
  DWORD NewMaxItemCount;
  
  (this->PathBuffer).ItemCount = 0;
  uVar1 = (this->PathBuffer).MaxItemCount;
  if (uVar1 < 0x40) {
    NewMaxItemCount = 0x40;
    if (0x20 < uVar1) {
      NewMaxItemCount = uVar1 * 2;
    }
    TGenericArray<char>::SetMaxItems(&this->PathBuffer,NewMaxItemCount);
  }
  TGenericArray<TPathStop>::GrowArray(&this->PathStops,0);
  uVar1 = (this->PathStops).MaxItemCount;
  if (uVar1 < 4) {
    TGenericArray<TPathStop>::SetMaxItems(&this->PathStops,(uint)(uVar1 == 3) * 2 + 4);
  }
  this->NodeIndex = 0;
  this->PathLength = 0;
  this->ItemCount = 0;
  this->SearchPhase = 2;
  return;
}

Assistant:

void BeginSearch()
    {
        // HOTS: 19586BD
        PathBuffer.ItemCount = 0;
        PathBuffer.SetMaxItemsIf(0x40);

        // HOTS: 19586E1
        // Set the new item count
        PathStops.GrowArray(0);
        PathStops.SetMaxItemsIf(4);

        PathLength = 0;
        NodeIndex = 0;
        ItemCount = 0;
        SearchPhase = MNDX_SEARCH_SEARCHING;
    }